

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::ShapeAtomTypesSectionParser::parseLine
          (ShapeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *this_00;
  ForceField *at;
  ForceField *this_01;
  string shapeTypeName;
  string shapeFile;
  StringTokenizer tokenizer;
  undefined1 local_b0 [32];
  string local_90;
  StringTokenizer local_70;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0," ;\t\n\r",(allocator<char> *)(local_b0 + 0x20));
  StringTokenizer::StringTokenizer((StringTokenizer *)(local_b0 + 0x40),line,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  iVar1 = StringTokenizer::countTokens((StringTokenizer *)(local_b0 + 0x40));
  if (iVar1 < 2) {
    snprintf(painCave.errMsg,2000,
             "ShapesAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_((string *)local_b0,(StringTokenizer *)(local_b0 + 0x40));
    StringTokenizer::nextToken_abi_cxx11_
              ((string *)(local_b0 + 0x20),(StringTokenizer *)(local_b0 + 0x40));
    at = (ForceField *)local_b0;
    this_01 = ff;
    this_00 = ForceField::getAtomType(ff,(string *)at);
    if (this_00 == (AtomType *)0x0) {
      this_00 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(this_00);
      AtomType::setIdent(this_00,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count + 1);
      AtomType::setName(this_00,(string *)local_b0);
      at = (ForceField *)local_b0;
      ForceField::addAtomType(ff,(string *)at,this_00);
      this_01 = ff;
    }
    parseShapeFile((ShapeAtomTypesSectionParser *)this_01,at,(string *)(local_b0 + 0x20),this_00);
    std::__cxx11::string::~string((string *)(local_b0 + 0x20));
    std::__cxx11::string::~string((string *)local_b0);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)(local_b0 + 0x40));
  return;
}

Assistant:

void ShapeAtomTypesSectionParser::parseLine(ForceField& ff,
                                              const std::string& line,
                                              int lineNo) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string shapeTypeName = tokenizer.nextToken();
      std::string shapeFile     = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(shapeTypeName);
      if (atomType == NULL) {
        atomType  = new AtomType();
        int ident = ff.getNAtomType() + 1;
        atomType->setIdent(ident);
        atomType->setName(shapeTypeName);
        ff.addAtomType(shapeTypeName, atomType);
      }

      parseShapeFile(ff, shapeFile, atomType);

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ShapesAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }